

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.cpp
# Opt level: O1

ReadStatus __thiscall
PartiallyDownloadedBlock::InitData
          (PartiallyDownloadedBlock *this,CBlockHeaderAndShortTxIDs *cmpctblock,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *extra_txn)

{
  ushort uVar1;
  pointer puVar2;
  long *plVar3;
  pointer psVar4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  element_type *peVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  ulong uVar13;
  pointer puVar14;
  mapped_type *pmVar15;
  uint64_t uVar16;
  pointer psVar17;
  __node_base_ptr p_Var18;
  Logger *this_00;
  __hash_code __code;
  long lVar19;
  ulong uVar20;
  ReadStatus RVar21;
  shared_ptr<const_CTransaction> *tx;
  CBlockHeader *pCVar22;
  pointer pPVar23;
  CBlockHeader *pCVar24;
  _Hash_node_base *p_Var25;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *p_Var26;
  ulong uVar27;
  __node_base_ptr p_Var28;
  uint uVar29;
  ulong uVar30;
  long in_FS_OFFSET;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  string_view logging_function;
  string_view source_file;
  unsigned_long local_e8;
  unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
  shorttxids;
  vector<bool,_std::allocator<bool>_> have_txn;
  uint256 local_78;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  undefined8 local_48;
  undefined8 local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  RVar21 = READ_STATUS_INVALID;
  if ((cmpctblock->header).nBits != 0) {
    puVar14 = (cmpctblock->shorttxids).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar2 = (cmpctblock->shorttxids).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((((puVar14 != puVar2) ||
         ((cmpctblock->prefilledtxn).
          super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (cmpctblock->prefilledtxn).
          super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
          super__Vector_impl_data._M_finish)) &&
        ((ulong)(((long)(cmpctblock->prefilledtxn).
                        super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(cmpctblock->prefilledtxn).
                        super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                ((long)puVar2 - (long)puVar14 >> 3)) < 0x186a1)) &&
       (((this->header).nBits == 0 &&
        ((this->txn_available).
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (this->txn_available).
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)))) {
      pCVar22 = &cmpctblock->header;
      pCVar24 = &this->header;
      for (lVar19 = 10; lVar19 != 0; lVar19 = lVar19 + -1) {
        uVar9 = (pCVar22->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0];
        uVar10 = (pCVar22->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1];
        uVar11 = (pCVar22->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2];
        uVar12 = (pCVar22->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3];
        pCVar24->nVersion = pCVar22->nVersion;
        (pCVar24->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0] = uVar9;
        (pCVar24->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1] = uVar10;
        (pCVar24->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2] = uVar11;
        (pCVar24->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3] = uVar12;
        pCVar22 = (CBlockHeader *)
                  ((pCVar22->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 4);
        pCVar24 = (CBlockHeader *)
                  ((pCVar24->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 4);
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::resize(&this->txn_available,
               ((long)(cmpctblock->prefilledtxn).
                      super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(cmpctblock->prefilledtxn).
                      super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
               ((long)(cmpctblock->shorttxids).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(cmpctblock->shorttxids).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3));
      pPVar23 = (cmpctblock->prefilledtxn).
                super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((cmpctblock->prefilledtxn).
          super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
          super__Vector_impl_data._M_finish == pPVar23) {
        uVar13 = 0;
      }
      else {
        uVar29 = 0xffffffff;
        lVar19 = 0x10;
        uVar30 = 0;
        do {
          plVar3 = *(long **)((long)pPVar23 + lVar19 + -8);
          if (((*plVar3 == plVar3[1]) && (plVar3[3] == plVar3[4])) ||
             ((uVar29 = uVar29 + *(ushort *)((long)pPVar23 + lVar19 + -0x10) + 1,
              0xffff < (int)uVar29 ||
              (((long)(cmpctblock->shorttxids).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(cmpctblock->shorttxids).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) + uVar30 < (ulong)uVar29))))
          goto LAB_00454e46;
          psVar17 = (this->txn_available).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar29;
          (psVar17->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               (element_type *)plVar3;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(psVar17->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&pPVar23->index + lVar19))
          ;
          uVar30 = uVar30 + 1;
          pPVar23 = (cmpctblock->prefilledtxn).
                    super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar13 = ((long)(cmpctblock->prefilledtxn).
                          super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar23 >> 3) *
                   -0x5555555555555555;
          lVar19 = lVar19 + 0x18;
        } while (uVar30 < uVar13);
      }
      this->prefilled_count = uVar13;
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_Hashtable(&shorttxids._M_h,
                   (long)(cmpctblock->shorttxids).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(cmpctblock->shorttxids).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3,(hash<unsigned_long> *)&have_txn,
                   (key_equal *)&criticalblock7,(allocator_type *)&local_78);
      puVar14 = (cmpctblock->shorttxids).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      RVar21 = READ_STATUS_INVALID;
      bVar31 = (cmpctblock->shorttxids).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish != puVar14;
      if (bVar31) {
        uVar30 = 0;
        uVar13 = 0;
        do {
          uVar20 = uVar13;
          do {
            uVar13 = uVar20;
            lVar19 = (uVar13 & 0xffff) + uVar30;
            uVar20 = (ulong)((int)uVar13 + 1);
          } while ((this->txn_available).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar19].
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                   (element_type *)0x0);
          pmVar15 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&shorttxids,puVar14 + uVar30);
          *pmVar15 = (mapped_type)lVar19;
          uVar20 = (cmpctblock->shorttxids).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar30] % shorttxids._M_h._M_bucket_count;
          p_Var25 = (_Hash_node_base *)0x0;
          if (shorttxids._M_h._M_buckets[uVar20] != (__node_base_ptr)0x0) {
            p_Var25 = shorttxids._M_h._M_buckets[uVar20]->_M_nxt;
          }
          if (p_Var25 != (_Hash_node_base *)0x0) {
            uVar27 = 0xffffffffffffffff;
            do {
              p_Var25 = p_Var25->_M_nxt;
              if ((p_Var25 != (_Hash_node_base *)0x0) &&
                 ((ulong)p_Var25[1]._M_nxt % shorttxids._M_h._M_bucket_count != uVar20)) {
                p_Var25 = (_Hash_node_base *)0x0;
              }
              uVar27 = uVar27 + 1;
            } while (p_Var25 != (_Hash_node_base *)0x0);
            if (0xb < uVar27) {
              RVar21 = READ_STATUS_FAILED;
              break;
            }
          }
          uVar30 = uVar30 + 1;
          puVar14 = (cmpctblock->shorttxids).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          bVar31 = uVar30 < (ulong)((long)(cmpctblock->shorttxids).
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar14
                                   >> 3);
        } while (bVar31);
      }
      if ((!bVar31) &&
         (RVar21 = READ_STATUS_FAILED,
         shorttxids._M_h._M_element_count ==
         (long)(cmpctblock->shorttxids).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(cmpctblock->shorttxids).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start >> 3)) {
        criticalblock7.super_unique_lock._M_device =
             (mutex_type *)((ulong)criticalblock7.super_unique_lock._M_device & 0xffffffffffffff00);
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&have_txn,
                   (long)(this->txn_available).
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->txn_available).
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4,(bool *)&criticalblock7,
                   (allocator_type *)&local_78);
        criticalblock7.super_unique_lock._M_device = &(this->pool->cs).super_recursive_mutex;
        criticalblock7.super_unique_lock._M_owns = false;
        std::unique_lock<std::recursive_mutex>::lock(&criticalblock7.super_unique_lock);
        psVar4 = (this->pool->txns_randomized).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (psVar17 = (this->pool->txns_randomized).
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; psVar17 != psVar4;
            psVar17 = psVar17 + 1) {
          uVar16 = SipHashUint256(cmpctblock->shorttxidk0,cmpctblock->shorttxidk1,
                                  &(((psVar17->
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->m_witness_hash).m_wrapped);
          p_Var25 = (_Hash_node_base *)(uVar16 & 0xffffffffffff);
          p_Var5 = shorttxids._M_h._M_buckets[(ulong)p_Var25 % shorttxids._M_h._M_bucket_count];
          p_Var18 = (__node_base_ptr)0x0;
          if ((p_Var5 != (__node_base_ptr)0x0) &&
             (p_Var18 = p_Var5, p_Var28 = p_Var5->_M_nxt, p_Var25 != p_Var5->_M_nxt[1]._M_nxt)) {
            while (p_Var6 = p_Var28->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
              p_Var18 = (__node_base_ptr)0x0;
              if (((ulong)p_Var6[1]._M_nxt % shorttxids._M_h._M_bucket_count !=
                   (ulong)p_Var25 % shorttxids._M_h._M_bucket_count) ||
                 (p_Var18 = p_Var28, p_Var28 = p_Var6, p_Var25 == p_Var6[1]._M_nxt))
              goto LAB_00454ace;
            }
            p_Var18 = (__node_base_ptr)0x0;
          }
LAB_00454ace:
          if (p_Var18 == (__node_base_ptr)0x0) {
            p_Var25 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var25 = p_Var18->_M_nxt;
          }
          if (p_Var25 != (_Hash_node_base *)0x0) {
            uVar1 = *(ushort *)&p_Var25[2]._M_nxt;
            p_Var26 = &(this->txn_available).
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar1].
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
            if ((have_txn.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar1 >> 6] >>
                 ((ulong)uVar1 & 0x3f) & 1) == 0) {
              p_Var26->_M_ptr =
                   (psVar17->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&p_Var26->_M_refcount,
                         &(psVar17->
                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount);
              lVar19 = 1;
              have_txn.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[*(ushort *)&p_Var25[2]._M_nxt >> 6] =
                   have_txn.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [*(ushort *)&p_Var25[2]._M_nxt >> 6] |
                   1L << ((byte)*(ushort *)&p_Var25[2]._M_nxt & 0x3f);
            }
            else {
              if (p_Var26->_M_ptr == (element_type *)0x0) goto LAB_00454b66;
              _Var7._M_pi = (p_Var26->_M_refcount)._M_pi;
              p_Var26->_M_ptr = (element_type *)0x0;
              p_Var26->_M_refcount = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              lVar19 = -1;
              if (_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
              }
            }
            this->mempool_count = this->mempool_count + lVar19;
          }
LAB_00454b66:
          if (this->mempool_count == shorttxids._M_h._M_element_count) break;
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock7.super_unique_lock);
        psVar17 = (extra_txn->
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((extra_txn->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_finish != psVar17) {
          uVar13 = 0;
          do {
            peVar8 = psVar17[uVar13].
                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (peVar8 != (element_type *)0x0) {
              uVar16 = SipHashUint256(cmpctblock->shorttxidk0,cmpctblock->shorttxidk1,
                                      &(peVar8->m_witness_hash).m_wrapped);
              p_Var25 = (_Hash_node_base *)(uVar16 & 0xffffffffffff);
              p_Var5 = shorttxids._M_h._M_buckets[(ulong)p_Var25 % shorttxids._M_h._M_bucket_count];
              p_Var18 = (__node_base_ptr)0x0;
              if ((p_Var5 != (__node_base_ptr)0x0) &&
                 (p_Var18 = p_Var5, p_Var28 = p_Var5->_M_nxt, p_Var25 != p_Var5->_M_nxt[1]._M_nxt))
              {
                while (p_Var6 = p_Var28->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
                  p_Var18 = (__node_base_ptr)0x0;
                  if (((ulong)p_Var6[1]._M_nxt % shorttxids._M_h._M_bucket_count !=
                       (ulong)p_Var25 % shorttxids._M_h._M_bucket_count) ||
                     (p_Var18 = p_Var28, p_Var28 = p_Var6, p_Var25 == p_Var6[1]._M_nxt))
                  goto LAB_00454c21;
                }
                p_Var18 = (__node_base_ptr)0x0;
              }
LAB_00454c21:
              if (p_Var18 == (__node_base_ptr)0x0) {
                p_Var25 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var25 = p_Var18->_M_nxt;
              }
              if (p_Var25 != (_Hash_node_base *)0x0) {
                uVar1 = *(ushort *)&p_Var25[2]._M_nxt;
                if ((have_txn.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar1 >> 6] >>
                     ((ulong)uVar1 & 0x3f) & 1) == 0) {
                  psVar17 = (extra_txn->
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar13;
                  psVar4 = (this->txn_available).
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar1;
                  (psVar4->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr = (psVar17->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                            (&(psVar4->
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                              _M_refcount,
                             &(psVar17->
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                              _M_refcount);
                  lVar19 = 1;
                  have_txn.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                  [*(ushort *)&p_Var25[2]._M_nxt >> 6] =
                       have_txn.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [*(ushort *)&p_Var25[2]._M_nxt >> 6] |
                       1L << ((byte)*(ushort *)&p_Var25[2]._M_nxt & 0x3f);
LAB_00454d0e:
                  this->mempool_count = this->mempool_count + lVar19;
                  this->extra_count = this->extra_count + lVar19;
                }
                else {
                  psVar17 = (this->txn_available).
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  lVar19 = (long)psVar17[uVar1].
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr;
                  if (lVar19 != 0) {
                    peVar8 = (extra_txn->
                             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar13].
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    auVar33[0] = -(*(char *)&(peVar8->m_witness_hash).m_wrapped ==
                                  *(char *)(lVar19 + 0x59));
                    auVar33[1] = -(*(uchar *)((long)&peVar8->m_witness_hash + 1) ==
                                  *(uchar *)(lVar19 + 0x5a));
                    auVar33[2] = -(*(uchar *)((long)&peVar8->m_witness_hash + 2) ==
                                  *(uchar *)(lVar19 + 0x5b));
                    auVar33[3] = -(*(uchar *)((long)&peVar8->m_witness_hash + 3) ==
                                  *(uchar *)(lVar19 + 0x5c));
                    auVar33[4] = -(*(uchar *)((long)&peVar8->m_witness_hash + 4) ==
                                  *(uchar *)(lVar19 + 0x5d));
                    auVar33[5] = -(*(uchar *)((long)&peVar8->m_witness_hash + 5) ==
                                  *(uchar *)(lVar19 + 0x5e));
                    auVar33[6] = -(*(uchar *)((long)&peVar8->m_witness_hash + 6) ==
                                  *(uchar *)(lVar19 + 0x5f));
                    auVar33[7] = -(*(uchar *)((long)&peVar8->m_witness_hash + 7) ==
                                  *(uchar *)(lVar19 + 0x60));
                    auVar33[8] = -(*(uchar *)((long)&peVar8->m_witness_hash + 8) ==
                                  *(uchar *)(lVar19 + 0x61));
                    auVar33[9] = -(*(uchar *)((long)&peVar8->m_witness_hash + 9) ==
                                  *(uchar *)(lVar19 + 0x62));
                    auVar33[10] = -(*(uchar *)((long)&peVar8->m_witness_hash + 10) ==
                                   *(uchar *)(lVar19 + 99));
                    auVar33[0xb] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0xb) ==
                                    *(uchar *)(lVar19 + 100));
                    auVar33[0xc] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0xc) ==
                                    *(uchar *)(lVar19 + 0x65));
                    auVar33[0xd] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0xd) ==
                                    *(uchar *)(lVar19 + 0x66));
                    auVar33[0xe] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0xe) ==
                                    *(uchar *)(lVar19 + 0x67));
                    auVar33[0xf] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0xf) ==
                                    *(uchar *)(lVar19 + 0x68));
                    auVar32[0] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0x10) ==
                                  *(uchar *)(lVar19 + 0x69));
                    auVar32[1] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0x11) ==
                                  *(uchar *)(lVar19 + 0x6a));
                    auVar32[2] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0x12) ==
                                  *(uchar *)(lVar19 + 0x6b));
                    auVar32[3] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0x13) ==
                                  *(uchar *)(lVar19 + 0x6c));
                    auVar32[4] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0x14) ==
                                  *(uchar *)(lVar19 + 0x6d));
                    auVar32[5] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0x15) ==
                                  *(uchar *)(lVar19 + 0x6e));
                    auVar32[6] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0x16) ==
                                  *(uchar *)(lVar19 + 0x6f));
                    auVar32[7] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0x17) ==
                                  *(uchar *)(lVar19 + 0x70));
                    auVar32[8] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0x18) ==
                                  *(uchar *)(lVar19 + 0x71));
                    auVar32[9] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0x19) ==
                                  *(uchar *)(lVar19 + 0x72));
                    auVar32[10] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0x1a) ==
                                   *(uchar *)(lVar19 + 0x73));
                    auVar32[0xb] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0x1b) ==
                                    *(uchar *)(lVar19 + 0x74));
                    auVar32[0xc] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0x1c) ==
                                    *(uchar *)(lVar19 + 0x75));
                    auVar32[0xd] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0x1d) ==
                                    *(uchar *)(lVar19 + 0x76));
                    auVar32[0xe] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0x1e) ==
                                    *(uchar *)(lVar19 + 0x77));
                    auVar32[0xf] = -(*(uchar *)((long)&peVar8->m_witness_hash + 0x1f) ==
                                    *(uchar *)(lVar19 + 0x78));
                    auVar32 = auVar32 & auVar33;
                    if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) != 0xffff) {
                      p_Var26 = &psVar17[uVar1].
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
                      _Var7._M_pi = (p_Var26->_M_refcount)._M_pi;
                      p_Var26->_M_ptr = (element_type *)0x0;
                      p_Var26->_M_refcount = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      lVar19 = -1;
                      if (_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
                      }
                      goto LAB_00454d0e;
                    }
                  }
                }
              }
              if (this->mempool_count == shorttxids._M_h._M_element_count) break;
            }
            uVar13 = uVar13 + 1;
            psVar17 = (extra_txn->
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          } while (uVar13 < (ulong)((long)(extra_txn->
                                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)psVar17 >> 4));
        }
        this_00 = LogInstance();
        bVar31 = BCLog::Logger::WillLogCategoryLevel(this_00,CMPCTBLOCK,Debug);
        if (bVar31) {
          CBlockHeader::GetHash(&local_78,&cmpctblock->header);
          base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock7,&local_78);
          CBlockHeaderAndShortTxIDs::
          SerializationOps<SizeComputer,CBlockHeaderAndShortTxIDs_const,ActionSerialize>(cmpctblock)
          ;
          local_e8 = 0;
          logging_function._M_str = "InitData";
          logging_function._M_len = 8;
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/blockencodings.cpp"
          ;
          source_file._M_len = 0x62;
          LogPrintFormatInternal<std::__cxx11::string,unsigned_long>
                    (logging_function,source_file,0xaa,CMPCTBLOCK,Debug,
                     (ConstevalFormatString<2U>)0x829a9c,(string *)&criticalblock7,&local_e8);
          if (criticalblock7.super_unique_lock._M_device != (mutex_type *)&stack0xffffffffffffffb8)
          {
            operator_delete(criticalblock7.super_unique_lock._M_device,local_48 + 1);
          }
        }
        if (have_txn.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(have_txn.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)have_txn.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)have_txn.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          have_txn.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          have_txn.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          have_txn.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          have_txn.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          have_txn.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
        }
        RVar21 = READ_STATUS_OK;
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&shorttxids._M_h);
    }
  }
LAB_00454e46:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return RVar21;
}

Assistant:

ReadStatus PartiallyDownloadedBlock::InitData(const CBlockHeaderAndShortTxIDs& cmpctblock, const std::vector<CTransactionRef>& extra_txn) {
    if (cmpctblock.header.IsNull() || (cmpctblock.shorttxids.empty() && cmpctblock.prefilledtxn.empty()))
        return READ_STATUS_INVALID;
    if (cmpctblock.shorttxids.size() + cmpctblock.prefilledtxn.size() > MAX_BLOCK_WEIGHT / MIN_SERIALIZABLE_TRANSACTION_WEIGHT)
        return READ_STATUS_INVALID;

    if (!header.IsNull() || !txn_available.empty()) return READ_STATUS_INVALID;

    header = cmpctblock.header;
    txn_available.resize(cmpctblock.BlockTxCount());

    int32_t lastprefilledindex = -1;
    for (size_t i = 0; i < cmpctblock.prefilledtxn.size(); i++) {
        if (cmpctblock.prefilledtxn[i].tx->IsNull())
            return READ_STATUS_INVALID;

        lastprefilledindex += cmpctblock.prefilledtxn[i].index + 1; //index is a uint16_t, so can't overflow here
        if (lastprefilledindex > std::numeric_limits<uint16_t>::max())
            return READ_STATUS_INVALID;
        if ((uint32_t)lastprefilledindex > cmpctblock.shorttxids.size() + i) {
            // If we are inserting a tx at an index greater than our full list of shorttxids
            // plus the number of prefilled txn we've inserted, then we have txn for which we
            // have neither a prefilled txn or a shorttxid!
            return READ_STATUS_INVALID;
        }
        txn_available[lastprefilledindex] = cmpctblock.prefilledtxn[i].tx;
    }
    prefilled_count = cmpctblock.prefilledtxn.size();

    // Calculate map of txids -> positions and check mempool to see what we have (or don't)
    // Because well-formed cmpctblock messages will have a (relatively) uniform distribution
    // of short IDs, any highly-uneven distribution of elements can be safely treated as a
    // READ_STATUS_FAILED.
    std::unordered_map<uint64_t, uint16_t> shorttxids(cmpctblock.shorttxids.size());
    uint16_t index_offset = 0;
    for (size_t i = 0; i < cmpctblock.shorttxids.size(); i++) {
        while (txn_available[i + index_offset])
            index_offset++;
        shorttxids[cmpctblock.shorttxids[i]] = i + index_offset;
        // To determine the chance that the number of entries in a bucket exceeds N,
        // we use the fact that the number of elements in a single bucket is
        // binomially distributed (with n = the number of shorttxids S, and p =
        // 1 / the number of buckets), that in the worst case the number of buckets is
        // equal to S (due to std::unordered_map having a default load factor of 1.0),
        // and that the chance for any bucket to exceed N elements is at most
        // buckets * (the chance that any given bucket is above N elements).
        // Thus: P(max_elements_per_bucket > N) <= S * (1 - cdf(binomial(n=S,p=1/S), N)).
        // If we assume blocks of up to 16000, allowing 12 elements per bucket should
        // only fail once per ~1 million block transfers (per peer and connection).
        if (shorttxids.bucket_size(shorttxids.bucket(cmpctblock.shorttxids[i])) > 12)
            return READ_STATUS_FAILED;
    }
    // TODO: in the shortid-collision case, we should instead request both transactions
    // which collided. Falling back to full-block-request here is overkill.
    if (shorttxids.size() != cmpctblock.shorttxids.size())
        return READ_STATUS_FAILED; // Short ID collision

    std::vector<bool> have_txn(txn_available.size());
    {
    LOCK(pool->cs);
    for (const auto& tx : pool->txns_randomized) {
        uint64_t shortid = cmpctblock.GetShortID(tx->GetWitnessHash());
        std::unordered_map<uint64_t, uint16_t>::iterator idit = shorttxids.find(shortid);
        if (idit != shorttxids.end()) {
            if (!have_txn[idit->second]) {
                txn_available[idit->second] = tx;
                have_txn[idit->second]  = true;
                mempool_count++;
            } else {
                // If we find two mempool txn that match the short id, just request it.
                // This should be rare enough that the extra bandwidth doesn't matter,
                // but eating a round-trip due to FillBlock failure would be annoying
                if (txn_available[idit->second]) {
                    txn_available[idit->second].reset();
                    mempool_count--;
                }
            }
        }
        // Though ideally we'd continue scanning for the two-txn-match-shortid case,
        // the performance win of an early exit here is too good to pass up and worth
        // the extra risk.
        if (mempool_count == shorttxids.size())
            break;
    }
    }

    for (size_t i = 0; i < extra_txn.size(); i++) {
        if (extra_txn[i] == nullptr) {
            continue;
        }
        uint64_t shortid = cmpctblock.GetShortID(extra_txn[i]->GetWitnessHash());
        std::unordered_map<uint64_t, uint16_t>::iterator idit = shorttxids.find(shortid);
        if (idit != shorttxids.end()) {
            if (!have_txn[idit->second]) {
                txn_available[idit->second] = extra_txn[i];
                have_txn[idit->second]  = true;
                mempool_count++;
                extra_count++;
            } else {
                // If we find two mempool/extra txn that match the short id, just
                // request it.
                // This should be rare enough that the extra bandwidth doesn't matter,
                // but eating a round-trip due to FillBlock failure would be annoying
                // Note that we don't want duplication between extra_txn and mempool to
                // trigger this case, so we compare witness hashes first
                if (txn_available[idit->second] &&
                        txn_available[idit->second]->GetWitnessHash() != extra_txn[i]->GetWitnessHash()) {
                    txn_available[idit->second].reset();
                    mempool_count--;
                    extra_count--;
                }
            }
        }
        // Though ideally we'd continue scanning for the two-txn-match-shortid case,
        // the performance win of an early exit here is too good to pass up and worth
        // the extra risk.
        if (mempool_count == shorttxids.size())
            break;
    }

    LogDebug(BCLog::CMPCTBLOCK, "Initialized PartiallyDownloadedBlock for block %s using a cmpctblock of size %lu\n", cmpctblock.header.GetHash().ToString(), GetSerializeSize(cmpctblock));

    return READ_STATUS_OK;
}